

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zz_red.c
# Opt level: O3

void zzRedBarr_fast(word *a,word *mod,size_t n,word *barr_param,void *stack)

{
  size_t n_00;
  word *a_00;
  word *c;
  int iVar1;
  word wVar2;
  
  n_00 = n + 1;
  a_00 = (word *)((long)stack + n * 8 + 8);
  c = a_00 + n + 2;
  zzMul((word *)stack,a + (n - 1),n_00,barr_param,n + 2,c + n * 2 + 2);
  zzMul(c,a_00,n + 2,mod,n,c + n * 2 + 2);
  zzSub2(a,c,n_00);
  while( true ) {
    iVar1 = wwCmp2(a,n_00,mod,n);
    if (iVar1 < 0) break;
    wVar2 = zzSub2(a,mod,n);
    a[n] = a[n] - wVar2;
  }
  return;
}

Assistant:

void FAST(zzRedBarr)(word a[], const word mod[], size_t n, 
	const word barr_param[], void* stack)
{
	// переменные в stack
	word* q = (word*)stack;
	word* qm = q + (n + 1) + (n + 2);
	stack = qm + (n + 2) + n;
	// pre
	ASSERT(wwIsDisjoint2(a, 2 * n, mod, n));
	ASSERT(wwIsDisjoint2(a, 2 * n, barr_param, n + 2));
	ASSERT(n > 0 && mod[n - 1] != 0);
	// q <- (a \div B^{n - 1}) * barr_param
	zzMul(q, a + n - 1, n + 1, barr_param, n + 2, stack);
	// qm <- (q \div B^{n + 1}) * mod
	zzMul(qm, q + n + 1, n + 2, mod, n, stack);
	// a <- [n + 1]a - [n + 1]qm
	zzSub2(a, qm, n + 1);
	// пока a >= mod: a <- a - mod
	while (wwCmp2(a, n + 1, mod, n) >= 0)
		a[n] -= zzSub2(a, mod, n);
}